

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3FkCheck(Parse *pParse,Table *pTab,int regOld,int regNew,int *aChange,int bChngRowid)

{
  u8 uVar1;
  int iVar2;
  sqlite3 *db;
  Schema *pSVar3;
  char *pcVar4;
  Trigger *pTVar5;
  Index *pIVar6;
  int iVar7;
  i16 iVar8;
  Table *pTVar9;
  Vdbe *p;
  i16 *piVar10;
  HashElem *pHVar11;
  SrcList *pSrc;
  Parse *pPVar12;
  undefined4 in_register_0000000c;
  Schema **ppSVar13;
  int *piVar14;
  undefined4 in_register_00000014;
  FKey *pFVar15;
  byte bVar16;
  uint isIgnore;
  int iVar17;
  sColMap *psVar18;
  char *zDbase;
  long lVar19;
  long lVar20;
  bool bVar21;
  int *aiFree;
  Index *pIdx;
  int *local_70;
  int *local_68;
  int local_60;
  int local_5c;
  undefined8 local_58;
  char *local_50;
  int local_48;
  int iCol;
  undefined8 local_40;
  i16 *local_38;
  
  local_58 = CONCAT44(in_register_00000014,regOld);
  local_40 = CONCAT44(in_register_0000000c,regNew);
  db = pParse->db;
  if (((db->flags & 0x4000) != 0) && (pTab->eTabType == '\0')) {
    if (pTab->pSchema == (Schema *)0x0) {
      iVar17 = -0x8000;
    }
    else {
      iVar17 = -1;
      ppSVar13 = &db->aDb->pSchema;
      do {
        iVar17 = iVar17 + 1;
        pSVar3 = *ppSVar13;
        ppSVar13 = ppSVar13 + 4;
      } while (pSVar3 != pTab->pSchema);
    }
    uVar1 = pParse->disableTriggers;
    pFVar15 = (pTab->u).tab.pFKey;
    local_70 = aChange;
    if (pFVar15 != (FKey *)0x0) {
      zDbase = db->aDb[iVar17].zDbSName;
      local_48 = regOld + 1;
      local_60 = bChngRowid;
      local_5c = iVar17;
      local_50 = zDbase;
      do {
        pIdx = (Index *)0x0;
        aiFree = (int *)0x0;
        if (aChange == (int *)0x0) {
LAB_0018e8f7:
          if (pParse->disableTriggers == '\0') {
            pTVar9 = sqlite3LocateTable(pParse,0,pFVar15->zTo,zDbase);
          }
          else {
            pTVar9 = sqlite3FindTable(db,pFVar15->zTo,zDbase);
          }
          if ((pTVar9 == (Table *)0x0) ||
             (iVar17 = sqlite3FkLocateIndex(pParse,pTVar9,pFVar15,&pIdx,&aiFree), pIVar6 = pIdx,
             iVar17 != 0)) {
            aChange = local_70;
            if (uVar1 == '\0') {
              bVar16 = 1;
            }
            else {
              bVar21 = db->mallocFailed == '\0';
              if (bVar21 && pTVar9 == (Table *)0x0) {
                p = sqlite3GetVdbe(pParse);
                iVar7 = local_48;
                iVar17 = pFVar15->nCol;
                if (0 < iVar17) {
                  iVar2 = p->nOp;
                  psVar18 = pFVar15->aCol;
                  lVar19 = 0;
                  do {
                    iVar8 = sqlite3TableColumnToStorage(pFVar15->pFrom,(i16)psVar18->iFrom);
                    sqlite3VdbeAddOp3(p,0x32,iVar8 + iVar7,iVar2 + iVar17 + 1,0);
                    lVar19 = lVar19 + 1;
                    psVar18 = psVar18 + 1;
                  } while (lVar19 < pFVar15->nCol);
                }
                sqlite3VdbeAddOp3(p,0x9e,(uint)pFVar15->isDeferred,-1,0);
                bChngRowid = local_60;
                goto LAB_0018eba5;
              }
              bVar16 = bVar21 * '\x03' + 1;
            }
          }
          else {
            piVar14 = aiFree;
            if (aiFree == (int *)0x0) {
              iCol = pFVar15->aCol[0].iFrom;
              piVar14 = &iCol;
            }
            local_68 = piVar14;
            if (pFVar15->nCol < 1) {
              isIgnore = 0;
            }
            else {
              local_38 = &pTVar9->iPKey;
              lVar19 = 0;
              lVar20 = 0;
              isIgnore = 0;
              do {
                if (*(int *)((long)piVar14 + lVar19 * 2) == (int)pTab->iPKey) {
                  *(undefined4 *)((long)piVar14 + lVar19 * 2) = 0xffffffff;
                }
                if (db->xAuth != (sqlite3_xauth)0x0) {
                  piVar10 = local_38;
                  if (pIVar6 != (Index *)0x0) {
                    piVar10 = (i16 *)((long)pIVar6->aiColumn + lVar19);
                  }
                  iVar17 = sqlite3AuthReadCol(pParse,pTVar9->zName,pTVar9->aCol[*piVar10].zCnName,
                                              local_5c);
                  isIgnore = (uint)(iVar17 == 2);
                  piVar14 = local_68;
                }
                lVar20 = lVar20 + 1;
                lVar19 = lVar19 + 2;
              } while (lVar20 < pFVar15->nCol);
            }
            iVar17 = local_5c;
            sqlite3TableLock(pParse,local_5c,pTVar9->tnum,'\0',pTVar9->zName);
            pParse->nTab = pParse->nTab + 1;
            if ((int)local_58 != 0) {
              fkLookupParent(pParse,iVar17,pTVar9,pIdx,pFVar15,local_68,(int)local_58,-1,isIgnore);
            }
            bChngRowid = local_60;
            if ((int)local_40 != 0) {
              pPVar12 = pParse->pToplevel;
              if (pParse->pToplevel == (Parse *)0x0) {
                pPVar12 = pParse;
              }
              if ((pPVar12->pTriggerPrg == (TriggerPrg *)0x0) ||
                 (((pTVar5 = pPVar12->pTriggerPrg->pTrigger, pTVar5 != pFVar15->apTrigger[0] ||
                   (pFVar15->aAction[0] != '\b')) &&
                  ((pTVar5 != pFVar15->apTrigger[1] || (pFVar15->aAction[1] != '\b')))))) {
                fkLookupParent(pParse,iVar17,pTVar9,pIdx,pFVar15,local_68,(int)local_40,1,isIgnore);
              }
            }
            if (aiFree != (int *)0x0) {
              sqlite3DbFreeNN(db,aiFree);
            }
LAB_0018eba5:
            bVar16 = 0;
            zDbase = local_50;
            aChange = local_70;
          }
        }
        else {
          pcVar4 = pFVar15->zTo;
          if (pTab->zName == (char *)0x0) {
            if (pcVar4 == (char *)0x0) goto LAB_0018e8f7;
          }
          else if (pcVar4 != (char *)0x0) {
            lVar19 = 0;
            do {
              bVar16 = pTab->zName[lVar19];
              if (bVar16 == pcVar4[lVar19]) {
                if ((ulong)bVar16 == 0) goto LAB_0018e8f7;
              }
              else if (""[bVar16] != ""[(byte)pcVar4[lVar19]]) break;
              lVar19 = lVar19 + 1;
            } while( true );
          }
          bVar16 = 0;
          if (0 < (long)pFVar15->nCol) {
            lVar19 = 0;
            do {
              iVar17 = *(int *)((long)&pFVar15->aCol[0].iFrom + lVar19);
              if ((-1 < aChange[iVar17]) || ((bChngRowid != 0 && (iVar17 == pTab->iPKey))))
              goto LAB_0018e8f7;
              lVar19 = lVar19 + 0x10;
            } while ((long)pFVar15->nCol * 0x10 != lVar19);
          }
        }
        if ((bVar16 & 3) != 0) {
          return;
        }
        pFVar15 = pFVar15->pNextFrom;
      } while (pFVar15 != (FKey *)0x0);
    }
    pHVar11 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
    pFVar15 = (FKey *)pHVar11->data;
    if (pFVar15 != (FKey *)0x0) {
      local_68 = (int *)(ulong)(aChange != (int *)0x0);
      do {
        pIdx = (Index *)0x0;
        aiFree = (int *)0x0;
        if (((aChange == (int *)0x0) ||
            (iVar17 = fkParentIsModified(pTab,pFVar15,aChange,bChngRowid), iVar17 != 0)) &&
           ((pFVar15->isDeferred != '\0' ||
            ((((db->flags & 0x80000) != 0 || (pParse->pToplevel != (Parse *)0x0)) ||
             (pParse->isMultiWrite != '\0')))))) {
          iVar17 = sqlite3FkLocateIndex(pParse,pTab,pFVar15,&pIdx,&aiFree);
          if (iVar17 == 0) {
            pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
            if (pSrc != (SrcList *)0x0) {
              pTVar9 = pFVar15->pFrom;
              pSrc->a[0].pTab = pTVar9;
              pSrc->a[0].zName = pTVar9->zName;
              pTVar9->nTabRef = pTVar9->nTabRef + 1;
              iVar17 = pParse->nTab;
              pParse->nTab = iVar17 + 1;
              pSrc->a[0].iCursor = iVar17;
              if ((int)local_40 != 0) {
                fkScanChildren(pParse,pSrc,pTab,pIdx,pFVar15,aiFree,(int)local_40,-1);
              }
              if ((int)local_58 != 0) {
                bVar16 = pFVar15->aAction[(long)local_68];
                fkScanChildren(pParse,pSrc,pTab,pIdx,pFVar15,aiFree,(int)local_58,1);
                if ((pFVar15->isDeferred == '\0') && ((bVar16 & 0xfd) != 8)) {
                  pPVar12 = pParse->pToplevel;
                  if (pParse->pToplevel == (Parse *)0x0) {
                    pPVar12 = pParse;
                  }
                  pPVar12->mayAbort = '\x01';
                }
              }
              pSrc->a[0].zName = (char *)0x0;
              sqlite3SrcListDelete(db,pSrc);
            }
            aChange = local_70;
            iVar17 = 0;
            if (aiFree != (int *)0x0) {
              sqlite3DbFreeNN(db,aiFree);
            }
          }
          else if (uVar1 == '\0') {
            iVar17 = 1;
          }
          else {
            iVar17 = 1;
            if (db->mallocFailed == '\0') {
              iVar17 = 0xd;
            }
          }
        }
        else {
          iVar17 = 0xd;
        }
      } while (((iVar17 == 0xd) || (iVar17 == 0)) &&
              (pFVar15 = pFVar15->pNextTo, pFVar15 != (FKey *)0x0));
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkCheck(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Row is being deleted from this table */
  int regOld,                     /* Previous row data is stored here */
  int regNew,                     /* New row data is stored here */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  FKey *pFKey;                    /* Used to iterate through FKs */
  int iDb;                        /* Index of database containing pTab */
  const char *zDb;                /* Name of database containing pTab */
  int isIgnoreErrors = pParse->disableTriggers;

  /* Exactly one of regOld and regNew should be non-zero. */
  assert( (regOld==0)!=(regNew==0) );

  /* If foreign-keys are disabled, this function is a no-op. */
  if( (db->flags&SQLITE_ForeignKeys)==0 ) return;
  if( !IsOrdinaryTable(pTab) ) return;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  zDb = db->aDb[iDb].zDbSName;

  /* Loop through all the foreign key constraints for which pTab is the
  ** child table (the table that the foreign key definition is part of).  */
  for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
    Table *pTo;                   /* Parent table of foreign key pFKey */
    Index *pIdx = 0;              /* Index on key columns in pTo */
    int *aiFree = 0;
    int *aiCol;
    int iCol;
    int i;
    int bIgnore = 0;

    if( aChange
     && sqlite3_stricmp(pTab->zName, pFKey->zTo)!=0
     && fkChildIsModified(pTab, pFKey, aChange, bChngRowid)==0
    ){
      continue;
    }

    /* Find the parent table of this foreign key. Also find a unique index
    ** on the parent key columns in the parent table. If either of these
    ** schema items cannot be located, set an error in pParse and return
    ** early.  */
    if( pParse->disableTriggers ){
      pTo = sqlite3FindTable(db, pFKey->zTo, zDb);
    }else{
      pTo = sqlite3LocateTable(pParse, 0, pFKey->zTo, zDb);
    }
    if( !pTo || sqlite3FkLocateIndex(pParse, pTo, pFKey, &pIdx, &aiFree) ){
      assert( isIgnoreErrors==0 || (regOld!=0 && regNew==0) );
      if( !isIgnoreErrors || db->mallocFailed ) return;
      if( pTo==0 ){
        /* If isIgnoreErrors is true, then a table is being dropped. In this
        ** case SQLite runs a "DELETE FROM xxx" on the table being dropped
        ** before actually dropping it in order to check FK constraints.
        ** If the parent table of an FK constraint on the current table is
        ** missing, behave as if it is empty. i.e. decrement the relevant
        ** FK counter for each row of the current table with non-NULL keys.
        */
        Vdbe *v = sqlite3GetVdbe(pParse);
        int iJump = sqlite3VdbeCurrentAddr(v) + pFKey->nCol + 1;
        for(i=0; i<pFKey->nCol; i++){
          int iFromCol, iReg;
          iFromCol = pFKey->aCol[i].iFrom;
          iReg = sqlite3TableColumnToStorage(pFKey->pFrom,iFromCol) + regOld+1;
          sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iJump); VdbeCoverage(v);
        }
        sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, -1);
      }
      continue;
    }
    assert( pFKey->nCol==1 || (aiFree && pIdx) );

    if( aiFree ){
      aiCol = aiFree;
    }else{
      iCol = pFKey->aCol[0].iFrom;
      aiCol = &iCol;
    }
    for(i=0; i<pFKey->nCol; i++){
      if( aiCol[i]==pTab->iPKey ){
        aiCol[i] = -1;
      }
      assert( pIdx==0 || pIdx->aiColumn[i]>=0 );
#ifndef SQLITE_OMIT_AUTHORIZATION
      /* Request permission to read the parent key columns. If the
      ** authorization callback returns SQLITE_IGNORE, behave as if any
      ** values read from the parent table are NULL. */
      if( db->xAuth ){
        int rcauth;
        char *zCol = pTo->aCol[pIdx ? pIdx->aiColumn[i] : pTo->iPKey].zCnName;
        rcauth = sqlite3AuthReadCol(pParse, pTo->zName, zCol, iDb);
        bIgnore = (rcauth==SQLITE_IGNORE);
      }
#endif
    }

    /* Take a shared-cache advisory read-lock on the parent table. Allocate
    ** a cursor to use to search the unique index on the parent key columns
    ** in the parent table.  */
    sqlite3TableLock(pParse, iDb, pTo->tnum, 0, pTo->zName);
    pParse->nTab++;

    if( regOld!=0 ){
      /* A row is being removed from the child table. Search for the parent.
      ** If the parent does not exist, removing the child row resolves an
      ** outstanding foreign key constraint violation. */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regOld, -1, bIgnore);
    }
    if( regNew!=0 && !isSetNullAction(pParse, pFKey) ){
      /* A row is being added to the child table. If a parent row cannot
      ** be found, adding the child row has violated the FK constraint.
      **
      ** If this operation is being performed as part of a trigger program
      ** that is actually a "SET NULL" action belonging to this very
      ** foreign key, then omit this scan altogether. As all child key
      ** values are guaranteed to be NULL, it is not possible for adding
      ** this row to cause an FK violation.  */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regNew, +1, bIgnore);
    }

    sqlite3DbFree(db, aiFree);
  }

  /* Loop through all the foreign key constraints that refer to this table.
  ** (the "child" constraints) */
  for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
    Index *pIdx = 0;              /* Foreign key index for pFKey */
    SrcList *pSrc;
    int *aiCol = 0;

    if( aChange && fkParentIsModified(pTab, pFKey, aChange, bChngRowid)==0 ){
      continue;
    }

    if( !pFKey->isDeferred && !(db->flags & SQLITE_DeferFKs)
     && !pParse->pToplevel && !pParse->isMultiWrite
    ){
      assert( regOld==0 && regNew!=0 );
      /* Inserting a single row into a parent table cannot cause (or fix)
      ** an immediate foreign key violation. So do nothing in this case.  */
      continue;
    }

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ){
      if( !isIgnoreErrors || db->mallocFailed ) return;
      continue;
    }
    assert( aiCol || pFKey->nCol==1 );

    /* Create a SrcList structure containing the child table.  We need the
    ** child table as a SrcList for sqlite3WhereBegin() */
    pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
    if( pSrc ){
      SrcItem *pItem = pSrc->a;
      pItem->pTab = pFKey->pFrom;
      pItem->zName = pFKey->pFrom->zName;
      pItem->pTab->nTabRef++;
      pItem->iCursor = pParse->nTab++;

      if( regNew!=0 ){
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regNew, -1);
      }
      if( regOld!=0 ){
        int eAction = pFKey->aAction[aChange!=0];
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regOld, 1);
        /* If this is a deferred FK constraint, or a CASCADE or SET NULL
        ** action applies, then any foreign key violations caused by
        ** removing the parent key will be rectified by the action trigger.
        ** So do not set the "may-abort" flag in this case.
        **
        ** Note 1: If the FK is declared "ON UPDATE CASCADE", then the
        ** may-abort flag will eventually be set on this statement anyway
        ** (when this function is called as part of processing the UPDATE
        ** within the action trigger).
        **
        ** Note 2: At first glance it may seem like SQLite could simply omit
        ** all OP_FkCounter related scans when either CASCADE or SET NULL
        ** applies. The trouble starts if the CASCADE or SET NULL action
        ** trigger causes other triggers or action rules attached to the
        ** child table to fire. In these cases the fk constraint counters
        ** might be set incorrectly if any OP_FkCounter related scans are
        ** omitted.  */
        if( !pFKey->isDeferred && eAction!=OE_Cascade && eAction!=OE_SetNull ){
          sqlite3MayAbort(pParse);
        }
      }
      pItem->zName = 0;
      sqlite3SrcListDelete(db, pSrc);
    }
    sqlite3DbFree(db, aiCol);
  }
}